

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_api_json_autogen.cpp
# Opt level: O0

ElementsDecodeRawTransactionTxInStruct * __thiscall
cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertToStruct
          (ElementsDecodeRawTransactionTxIn *this)

{
  long in_RSI;
  ElementsDecodeRawTransactionTxInStruct *in_RDI;
  ElementsDecodeRawTransactionTxInStruct *result;
  ElementsDecodeUnlockingScriptStruct *in_stack_fffffffffffffd98;
  ElementsDecodeIssuanceStruct *pEVar1;
  ElementsDecodeUnlockingScriptStruct *in_stack_fffffffffffffda0;
  ElementsDecodeIssuanceStruct *this_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  ElementsDecodeRawTransactionTxInStruct *this_02;
  ElementsDecodeRawTransactionTxInStruct *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe08;
  undefined1 local_c8 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98 [5];
  undefined1 local_11;
  
  local_11 = 0;
  this_02 = in_RDI;
  ElementsDecodeRawTransactionTxInStruct::ElementsDecodeRawTransactionTxInStruct
            (in_stack_fffffffffffffdf0);
  std::__cxx11::string::operator=((string *)this_02,(string *)(in_RSI + 0x38));
  std::__cxx11::string::operator=((string *)&this_02->txid,(string *)(in_RSI + 0x58));
  this_02->vout = *(uint32_t *)(in_RSI + 0x78);
  ElementsDecodeUnlockingScript::ConvertToStruct((ElementsDecodeUnlockingScript *)this_02);
  this_01 = local_98;
  ElementsDecodeUnlockingScriptStruct::operator=
            (in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
  ElementsDecodeUnlockingScriptStruct::~ElementsDecodeUnlockingScriptStruct
            (in_stack_fffffffffffffda0);
  this_02->is_pegin = (bool)(*(byte *)(in_RSI + 0xf8) & 1);
  this_02->sequence = *(int64_t *)(in_RSI + 0x100);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe08);
  __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)(local_c8 + 0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_01,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  core::
  JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::ConvertToStruct((JsonValueVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)in_stack_fffffffffffffe08);
  this_00 = (ElementsDecodeIssuanceStruct *)local_c8;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(this_01,__x);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_01);
  ElementsDecodeIssuance::ConvertToStruct((ElementsDecodeIssuance *)this_02);
  pEVar1 = (ElementsDecodeIssuanceStruct *)&stack0xfffffffffffffdd0;
  ElementsDecodeIssuanceStruct::operator=(this_00,pEVar1);
  ElementsDecodeIssuanceStruct::~ElementsDecodeIssuanceStruct(this_00);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)this_00,
              (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)pEVar1);
  return in_RDI;
}

Assistant:

ElementsDecodeRawTransactionTxInStruct ElementsDecodeRawTransactionTxIn::ConvertToStruct() const {  // NOLINT
  ElementsDecodeRawTransactionTxInStruct result;
  result.coinbase = coinbase_;
  result.txid = txid_;
  result.vout = vout_;
  result.script_sig = script_sig_.ConvertToStruct();
  result.is_pegin = is_pegin_;
  result.sequence = sequence_;
  result.txinwitness = txinwitness_.ConvertToStruct();
  result.pegin_witness = pegin_witness_.ConvertToStruct();
  result.issuance = issuance_.ConvertToStruct();
  result.ignore_items = ignore_items;
  return result;
}